

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void decode_block(AV1Decoder *pbi,ThreadData_conflict *td,int mi_row,int mi_col,aom_reader *r,
                 PARTITION_TYPE partition,BLOCK_SIZE bsize)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int num_planes;
  DecoderCodingBlock *dcb;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
  num_planes = (uint)(((pbi->common).seq_params)->monochrome == '\0') * 2 + 1;
  iVar3 = (pbi->common).mi_params.mi_stride;
  iVar4 = iVar3 * mi_row + mi_col;
  (td->dcb).xd.mi = (pbi->common).mi_params.mi_grid_base + iVar4;
  (td->dcb).xd.tx_type_map = (pbi->common).mi_params.tx_type_map + iVar4;
  (td->dcb).xd.tx_type_map_stride = iVar3;
  set_plane_n4((MACROBLOCKD *)td,(uint)bVar1,(uint)bVar2,num_planes);
  set_mi_row_col((MACROBLOCKD *)td,&(td->dcb).xd.tile,mi_row,(uint)bVar2,mi_col,(uint)bVar1,
                 (pbi->common).mi_params.mi_rows,(pbi->common).mi_params.mi_cols);
  av1_setup_dst_planes
            ((td->dcb).xd.plane,bsize,&((pbi->common).cur_frame)->buf,mi_row,mi_col,0,num_planes);
  decode_token_recon_block(pbi,td,r,bsize);
  return;
}

Assistant:

static inline void decode_block(AV1Decoder *const pbi, ThreadData *const td,
                                int mi_row, int mi_col, aom_reader *r,
                                PARTITION_TYPE partition, BLOCK_SIZE bsize) {
  (void)partition;
  set_offsets_for_pred_and_recon(pbi, td, mi_row, mi_col, bsize);
  decode_token_recon_block(pbi, td, r, bsize);
}